

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_sock_write_from_fd(int fd,fio_packet_s *packet)

{
  uintptr_t *puVar1;
  short *psVar2;
  long *ptr;
  fio_data_s *pfVar3;
  ssize_t sVar4;
  int *piVar5;
  long lVar6;
  uintptr_t __offset;
  uintptr_t uVar7;
  size_t __nbytes;
  ulong __nbytes_00;
  long lVar8;
  char buff [49152];
  undefined1 local_c038 [49160];
  
  uVar7 = packet->length;
  lVar8 = (long)fd * 0xa8;
  lVar6 = 0;
  do {
    __offset = packet->offset + lVar6;
    packet->offset = __offset;
    __nbytes = uVar7 - lVar6;
    packet->length = __nbytes;
    if (0xbfff < __nbytes) {
      __nbytes = 0xc000;
    }
    sVar4 = pread(*(int *)&packet->data,local_c038,__nbytes,__offset);
    pfVar3 = fio_data;
    if (sVar4 < 1) {
      if (lVar6 != 0) {
        piVar5 = __errno_location();
        do {
          if ((*piVar5 != 4) && (*piVar5 != 0xb)) {
            lVar6 = 0xffffffff;
            goto LAB_0012d4c6;
          }
          __nbytes_00 = packet->length;
          if (0xbfff < __nbytes_00) {
            __nbytes_00 = 0xc000;
          }
          sVar4 = pread(*(int *)&packet->data,local_c038,__nbytes_00,packet->offset);
        } while (sVar4 < 1);
        goto LAB_0012d475;
      }
      ptr = *(long **)((long)fio_data + lVar8 + 0x40);
      *(long *)((long)fio_data + lVar8 + 0x40) = *ptr;
      LOCK();
      psVar2 = (short *)((long)pfVar3 + lVar8 + 0x68);
      *psVar2 = *psVar2 + -1;
      pfVar3 = fio_data;
      UNLOCK();
      lVar6 = (long)fio_data + lVar8 + 0x40;
      if (*ptr == 0) {
        *(long *)(lVar6 + 8) = lVar6;
        *(undefined2 *)((long)pfVar3 + lVar8 + 0x68) = 0;
      }
      else if (ptr == *(long **)(lVar6 + 8)) {
        *(long *)(lVar6 + 8) = lVar6;
      }
      (*(code *)ptr[2])(ptr[3]);
      fio_free(ptr);
LAB_0012d553:
      lVar6 = 1;
      goto LAB_0012d4c6;
    }
LAB_0012d475:
    lVar6 = (**(code **)(*(long *)((long)fio_data + lVar8 + 0xa8) + 8))
                      ((long)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar8 + 0x6d)),
                       *(undefined8 *)((long)fio_data + lVar8 + 0xb0),local_c038,sVar4);
    if (lVar6 != sVar4) {
      if (lVar6 < 0) {
        lVar6 = 0;
      }
      else {
        packet->offset = packet->offset + lVar6;
        puVar1 = &packet->length;
        *puVar1 = *puVar1 - lVar6;
        if (*puVar1 == 0) {
          fio_sock_packet_rotate_unsafe((long)fd);
          goto LAB_0012d553;
        }
      }
      goto LAB_0012d4c6;
    }
    uVar7 = packet->length;
    lVar6 = sVar4;
  } while (uVar7 != 0);
  packet->offset = packet->offset + sVar4;
  packet->length = -sVar4;
LAB_0012d4c6:
  return (int)lVar6;
}

Assistant:

static int fio_sock_write_from_fd(int fd, fio_packet_s *packet) {
  ssize_t asked = 0;
  ssize_t sent = 0;
  ssize_t total = 0;
  char buff[BUFFER_FILE_READ_SIZE];
  do {
    packet->offset += sent;
    packet->length -= sent;
  retry:
    asked = pread(packet->data.fd, buff,
                  ((packet->length < BUFFER_FILE_READ_SIZE)
                       ? packet->length
                       : BUFFER_FILE_READ_SIZE),
                  packet->offset);
    if (asked <= 0)
      goto read_error;
    sent = fd_data(fd).rw_hooks->write(fd2uuid(fd), fd_data(fd).rw_udata, buff,
                                       asked);
  } while (sent == asked && packet->length);
  if (sent >= 0) {
    packet->offset += sent;
    packet->length -= sent;
    total += sent;
    if (!packet->length) {
      fio_sock_packet_rotate_unsafe(fd);
      return 1;
    }
  }
  return total;

read_error:
  if (sent == 0) {
    fio_sock_packet_rotate_unsafe(fd);
    return 1;
  }
  if (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
    goto retry;
  return -1;
}